

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

locale booster::locale::impl_std::create_basic_formatting<char>(locale *in,string *locale_name)

{
  char *pcVar1;
  _Impl *in_RDI;
  string *in_stack_00000020;
  locale *in_stack_00000028;
  locale base;
  locale *tmp;
  _Impl *base_00;
  locale in_stack_ffffffffffffffc0;
  time_put_from_base<char> *in_stack_ffffffffffffffd0;
  locale in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  byte bVar3;
  
  uVar2 = 0;
  base_00 = in_RDI;
  create_basic_parsing<char>(in_stack_00000028,in_stack_00000020);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::locale::locale((locale *)&stack0xffffffffffffffd8,pcVar1);
  operator_new(0x18);
  time_put_from_base<char>::time_put_from_base
            ((time_put_from_base<char> *)in_stack_ffffffffffffffc0._M_impl,(locale *)base_00,
             (size_t)in_RDI);
  std::locale::locale<booster::locale::impl_std::time_put_from_base<char>>
            ((locale *)CONCAT17(uVar2,in_stack_ffffffffffffffe0),
             (locale *)in_stack_ffffffffffffffd8._M_impl,in_stack_ffffffffffffffd0);
  std::locale::operator=((locale *)in_RDI,(locale *)&stack0xffffffffffffffc0);
  std::locale::~locale((locale *)&stack0xffffffffffffffc0);
  bVar3 = 1;
  std::locale::~locale((locale *)&stack0xffffffffffffffd8);
  if ((bVar3 & 1) == 0) {
    std::locale::~locale((locale *)in_RDI);
  }
  return (locale)base_00;
}

Assistant:

std::locale create_basic_formatting(std::locale const &in,std::string const &locale_name)
{
    std::locale tmp = create_basic_parsing<CharType>(in,locale_name);
    std::locale base(locale_name.c_str());
    tmp = std::locale(tmp,new time_put_from_base<CharType>(base));
    return tmp;
}